

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

void try_initialize_global_cpu_info(void)

{
  __cpu_mask *p_Var1;
  int *piVar2;
  uint *puVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  FILE *pFVar8;
  char *pcVar9;
  CpuSet *pCVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint __max_leaf;
  size_type __n;
  long lVar14;
  CpuSet *pCVar15;
  int i;
  bool bVar16;
  int max_freq_khz;
  int iVar17;
  byte bVar18;
  uint in_XCR0;
  int freq_khz;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  char line [1024];
  int local_458;
  int local_454;
  vector<int,_std::allocator<int>_> local_450;
  void *local_438;
  iterator iStack_430;
  int *local_428;
  
  bVar18 = 0;
  if (g_cpu_info_initialized != '\0') {
    return;
  }
  pFVar8 = fopen("/proc/cpuinfo","rb");
  if (pFVar8 == (FILE *)0x0) {
    g_cpucount = 1;
  }
  else {
    iVar13 = 0;
    while ((iVar5 = feof(pFVar8), iVar5 == 0 &&
           (pcVar9 = fgets((char *)&local_438,0x400,pFVar8), pcVar9 != (char *)0x0))) {
      iVar13 = iVar13 + (uint)((char)iStack_430._M_current == 'r' &&
                              local_438 == (void *)0x6f737365636f7270);
    }
    fclose(pFVar8);
    g_cpucount = 1;
    if (1 < iVar13) {
      g_cpucount = iVar13;
    }
  }
  local_438 = (void *)0x0;
  iStack_430._M_current = (int *)0x0;
  local_428 = (int *)0x0;
  iVar5 = 0;
  iVar13 = 0;
  do {
    local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = get_thread_siblings(iVar5);
    if ((int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start != -1) {
      if ((long)iStack_430._M_current - (long)local_438 != 0) {
        lVar12 = (long)iStack_430._M_current - (long)local_438 >> 2;
        lVar14 = 0;
        do {
          if (*(int *)((long)local_438 + lVar14 * 4) ==
              (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) goto LAB_005e9dde;
          lVar14 = lVar14 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar14);
      }
      if (iStack_430._M_current == local_428) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_438,iStack_430,(int *)&local_450);
      }
      else {
        *iStack_430._M_current =
             (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iStack_430._M_current = iStack_430._M_current + 1;
      }
      iVar13 = iVar13 + 1;
    }
LAB_005e9dde:
    iVar17 = g_cpucount;
    iVar5 = iVar5 + 1;
  } while (iVar5 < g_cpucount);
  if (local_438 != (void *)0x0) {
    operator_delete(local_438,(long)local_428 - (long)local_438);
  }
  if (iVar13 == 0) {
    iVar13 = iVar17;
  }
  g_physical_cpucount = iVar13;
  if (iVar17 <= iVar13) {
    g_physical_cpucount = iVar17;
  }
  g_powersave = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[0] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[1] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[2] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[3] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[4] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[5] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[6] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[7] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[8] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[9] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[10] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[0xb] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[0xc] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[0xd] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[0xe] = 0;
  g_cpu_affinity_mask_all.cpu_set.__bits[0xf] = 0;
  __n = (size_type)g_cpucount;
  if (0 < (long)__n) {
    uVar11 = 0;
    do {
      if (uVar11 < 0x400) {
        p_Var1 = g_cpu_affinity_mask_all.cpu_set.__bits + (uVar11 >> 6);
        *p_Var1 = *p_Var1 | 1L << ((byte)uVar11 & 0x3f);
      }
      uVar11 = uVar11 + 1;
    } while (__n != uVar11);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_450,__n,(allocator_type *)&local_438);
  if (g_cpucount < 1) {
    iVar5 = 0x7fffffff;
    iVar13 = 0;
  }
  else {
    uVar11 = 0;
    iVar13 = 0;
    iVar5 = 0x7fffffff;
    do {
      local_454 = iVar5;
      sprintf((char *)&local_438,"/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state",
              uVar11 & 0xffffffff);
      pFVar8 = fopen((char *)&local_438,"rb");
      if (pFVar8 == (FILE *)0x0) {
        sprintf((char *)&local_438,"/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state",
                uVar11 & 0xffffffff);
        pFVar8 = fopen((char *)&local_438,"rb");
        if (pFVar8 != (FILE *)0x0) {
          iVar5 = 0;
          do {
            iVar17 = iVar5;
            iVar5 = feof(pFVar8);
            if (iVar5 != 0) break;
            local_458 = 0;
            iVar6 = __isoc99_fscanf(pFVar8,"%d %*d",&local_458);
            iVar5 = local_458;
            if (local_458 <= iVar17) {
              iVar5 = iVar17;
            }
          } while (iVar6 == 1);
          fclose(pFVar8);
          if (iVar17 != 0) goto LAB_005e9f3b;
        }
        sprintf((char *)&local_438,"/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq",
                uVar11 & 0xffffffff);
        pFVar8 = fopen((char *)&local_438,"rb");
        if (pFVar8 == (FILE *)0x0) {
          iVar17 = -1;
        }
        else {
          local_458 = -1;
          iVar5 = __isoc99_fscanf(pFVar8,"%d",&local_458);
          if (iVar5 != 1) {
            try_initialize_global_cpu_info();
          }
          fclose(pFVar8);
          iVar17 = local_458;
        }
      }
      else {
        iVar5 = 0;
        do {
          iVar17 = iVar5;
          iVar5 = feof(pFVar8);
          if (iVar5 != 0) break;
          local_458 = 0;
          iVar6 = __isoc99_fscanf(pFVar8,"%d %*d",&local_458);
          iVar5 = local_458;
          if (local_458 <= iVar17) {
            iVar5 = iVar17;
          }
        } while (iVar6 == 1);
        fclose(pFVar8);
      }
LAB_005e9f3b:
      if (iVar13 < iVar17) {
        iVar13 = iVar17;
      }
      iVar5 = local_454;
      if (iVar17 < local_454) {
        iVar5 = iVar17;
      }
      *(int *)(CONCAT44(local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) + uVar11 * 4) = iVar17;
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)g_cpucount);
  }
  iVar5 = (iVar5 + iVar13) / 2;
  if (iVar5 == iVar13) {
    g_cpu_affinity_mask_little.cpu_set.__bits[0xe] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[0xf] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[0xc] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[0xd] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[10] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[0xb] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[8] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[9] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[6] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[7] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[4] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[5] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[2] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[3] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[0] = 0;
    g_cpu_affinity_mask_little.cpu_set.__bits[1] = 0;
    pCVar10 = &g_cpu_affinity_mask_all;
    pCVar15 = &g_cpu_affinity_mask_big;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pCVar15->cpu_set).__bits[0] = (pCVar10->cpu_set).__bits[0];
      pCVar10 = (CpuSet *)((long)pCVar10 + ((ulong)bVar18 * -2 + 1) * 8);
      pCVar15 = (CpuSet *)((long)pCVar15 + ((ulong)bVar18 * -2 + 1) * 8);
    }
  }
  else if (0 < g_cpucount) {
    uVar11 = 0;
    do {
      sprintf((char *)&local_438,"/sys/devices/system/cpu/cpu%d/topology/core_cpus_list",
              uVar11 & 0xffffffff);
      pFVar8 = fopen((char *)&local_438,"rb");
      if (pFVar8 == (FILE *)0x0) {
        sprintf((char *)&local_438,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list",
                uVar11 & 0xffffffff);
        pFVar8 = fopen((char *)&local_438,"rb");
        if (pFVar8 != (FILE *)0x0) goto LAB_005ea14f;
LAB_005ea1a2:
        pCVar10 = &g_cpu_affinity_mask_big;
        if (*(int *)(CONCAT44(local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) + uVar11 * 4) < iVar5) {
          pCVar10 = &g_cpu_affinity_mask_little;
        }
      }
      else {
LAB_005ea14f:
        bVar16 = false;
        do {
          iVar13 = feof(pFVar8);
          if (iVar13 != 0) goto LAB_005ea17b;
          uVar7 = fgetc(pFVar8);
        } while ((uVar7 & 0xfe) != 0x2c);
        bVar16 = true;
LAB_005ea17b:
        fclose(pFVar8);
        if (!bVar16) goto LAB_005ea1a2;
        pCVar10 = &g_cpu_affinity_mask_big;
      }
      if (uVar11 < 0x400) {
        p_Var1 = (pCVar10->cpu_set).__bits + (uVar11 >> 6);
        *p_Var1 = *p_Var1 | 1L << ((byte)uVar11 & 0x3f);
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)g_cpucount);
  }
  pvVar4 = (void *)CONCAT44(local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_450.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  get_elf_hwcap(0x10);
  get_elf_hwcap(0x1a);
  g_cpu_support_x86_fma = 0;
  piVar2 = (int *)cpuid_basic_info(0);
  iVar13 = *piVar2;
  g_cpu_support_x86_avx = 0;
  if (0 < iVar13) {
    lVar12 = cpuid_Version_info(1);
    g_cpu_support_x86_avx = 0;
    if ((~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0) {
      g_cpu_support_x86_avx = (int)((~in_XCR0 & 6) == 0);
    }
  }
  if (6 < iVar13) {
    lVar12 = cpuid_Version_info(1);
    if (((~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0) &&
       (g_cpu_support_x86_fma = *(uint *)(lVar12 + 0xc) & 0x1000, (~in_XCR0 & 6) != 0)) {
      g_cpu_support_x86_fma = 0;
    }
  }
  puVar3 = (uint *)cpuid(0x80000000);
  g_cpu_support_x86_f16c = 0;
  g_cpu_support_x86_xop = 0;
  if (0x80000000 < *puVar3) {
    lVar12 = cpuid(0x80000001);
    g_cpu_support_x86_xop = *(uint *)(lVar12 + 0xc) & 0x800;
  }
  if (0 < iVar13) {
    lVar12 = cpuid_Version_info(1);
    g_cpu_support_x86_f16c = *(uint *)(lVar12 + 0xc) & 0x20000000;
  }
  if ((iVar13 < 7) ||
     (lVar12 = cpuid_Version_info(1), (*(uint *)(lVar12 + 0xc) & 0x1c000000) != 0x1c000000)) {
    g_cpu_support_x86_avx2 = 0;
    g_cpu_support_x86_avx_vnni = 0;
  }
  else {
    g_cpu_support_x86_avx2 = 0;
    if ((~in_XCR0 & 6) == 0) {
      lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
      g_cpu_support_x86_avx2 = *(uint *)(lVar12 + 4) & 0x20;
    }
    g_cpu_support_x86_avx_vnni = 0;
    if ((~in_XCR0 & 6) == 0) {
      puVar3 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
      g_cpu_support_x86_avx_vnni = *puVar3 & 0x10;
    }
  }
  if (iVar13 < 7) {
    g_cpu_support_x86_avx_vnni_int8 = 0;
    g_cpu_support_x86_avx_vnni_int16 = 0;
LAB_005ea395:
    if (6 < iVar13) {
      lVar12 = cpuid_Version_info(1);
      g_cpu_support_x86_avx_ne_convert = 0;
      if (((~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0) &&
         (g_cpu_support_x86_avx_ne_convert = 0, (~in_XCR0 & 6) == 0)) {
        lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx_ne_convert = *(uint *)(lVar12 + 8) & 0x20;
      }
      goto LAB_005ea448;
    }
    g_cpu_support_x86_avx_ne_convert = 0;
    g_cpu_support_x86_avx512 = 0;
LAB_005ea4ac:
    if (6 < iVar13) {
      lVar12 = cpuid_Version_info(1);
      g_cpu_support_x86_avx512_vnni = 0;
      if (((~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0) &&
         (g_cpu_support_x86_avx512_vnni = 0, (~in_XCR0 & 0xe6) == 0)) {
        lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512_vnni = *(uint *)(lVar12 + 0xc) & 0x800;
      }
      goto LAB_005ea506;
    }
    g_cpu_support_x86_avx512_vnni = 0;
    g_cpu_support_x86_avx512_bf16 = 0;
  }
  else {
    lVar12 = cpuid_Version_info(1);
    g_cpu_support_x86_avx_vnni_int8 = 0;
    if (((~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0) &&
       (g_cpu_support_x86_avx_vnni_int8 = 0, (~in_XCR0 & 6) == 0)) {
      lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
      g_cpu_support_x86_avx_vnni_int8 = *(uint *)(lVar12 + 8) & 0x10;
    }
    if (6 < iVar13) {
      lVar12 = cpuid_Version_info(1);
      g_cpu_support_x86_avx_vnni_int16 = 0;
      if (((~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0) &&
         (g_cpu_support_x86_avx_vnni_int16 = 0, (~in_XCR0 & 6) == 0)) {
        lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx_vnni_int16 = *(uint *)(lVar12 + 8) & 0x400;
      }
      goto LAB_005ea395;
    }
    g_cpu_support_x86_avx_vnni_int16 = 0;
    g_cpu_support_x86_avx_ne_convert = 0;
LAB_005ea448:
    if (6 < iVar13) {
      lVar12 = cpuid_Version_info(1);
      g_cpu_support_x86_avx512 = 0;
      if (((~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0) &&
         (g_cpu_support_x86_avx512 = 0, (~in_XCR0 & 0xe6) == 0)) {
        lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
        g_cpu_support_x86_avx512 = *(uint *)(lVar12 + 4) >> 0x1f;
        if ((~*(uint *)(lVar12 + 4) & 0x50030000) != 0) {
          g_cpu_support_x86_avx512 = 0;
        }
      }
      goto LAB_005ea4ac;
    }
    g_cpu_support_x86_avx512 = 0;
    g_cpu_support_x86_avx512_vnni = 0;
LAB_005ea506:
    if (iVar13 < 7) {
      g_cpu_support_x86_avx512_bf16 = 0;
      g_cpu_support_x86_avx512_fp16 = 0;
      goto LAB_005ea5ac;
    }
    lVar12 = cpuid_Version_info(1);
    g_cpu_support_x86_avx512_bf16 = 0;
    if (((~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0) &&
       (g_cpu_support_x86_avx512_bf16 = 0, (~in_XCR0 & 6) == 0)) {
      puVar3 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
      g_cpu_support_x86_avx512_bf16 = *puVar3 & 0x20;
    }
  }
  g_cpu_support_x86_avx512_fp16 = 0;
  if (((6 < iVar13) &&
      (lVar12 = cpuid_Version_info(1), (~*(uint *)(lVar12 + 0xc) & 0x1c000000) == 0)) &&
     (g_cpu_support_x86_avx512_fp16 = 0, (~in_XCR0 & 0xe6) == 0)) {
    lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
    g_cpu_support_x86_avx512_fp16 = *(uint *)(lVar12 + 8) & 0x800000;
  }
LAB_005ea5ac:
  iVar13 = get_big_cpu_data_cache_size(2);
  if (iVar13 < 1) {
    lVar12 = sysconf(0xbf);
    iVar13 = (int)lVar12;
  }
  g_cpu_level2_cachesize = iVar13;
  if (iVar13 < 1) {
    iVar13 = 0x40000;
    if (g_cpu_support_x86_avx2 == 0) {
      iVar13 = (uint)(g_cpu_support_x86_avx != 0) * 0x10000 + 0x10000;
    }
    g_cpu_level2_cachesize = 0x100000;
    if (g_cpu_support_x86_avx512 == 0) {
      g_cpu_level2_cachesize = iVar13;
    }
  }
  iVar13 = get_big_cpu_data_cache_size(3);
  if (iVar13 < 1) {
    lVar12 = sysconf(0xc2);
    iVar13 = (int)lVar12;
  }
  g_cpu_info_initialized = 1;
  g_cpu_level3_cachesize = iVar13;
  return;
}

Assistant:

static inline void try_initialize_global_cpu_info()
{
    if (!g_cpu_info_initialized)
    {
        initialize_global_cpu_info();
        g_cpu_info_initialized = 1;
    }
}